

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O1

void Assimp::IFC::ProcessRevolvedAreaSolid
               (IfcRevolvedAreaSolid *solid,TempMesh *result,ConversionData *conv)

{
  pointer *ppaVar1;
  double *pdVar2;
  iterator iVar3;
  pointer paVar4;
  double dVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  IfcRevolvedAreaSolid *pIVar6;
  bool bVar7;
  int iVar8;
  IfcProfileDef *pIVar9;
  IfcAxis1Placement *in;
  ulong uVar10;
  IfcAxis2Placement3D *in_00;
  uint uVar11;
  size_t __n;
  aiVector3t<double> *paVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  void *__src;
  ulong uVar16;
  long lVar17;
  pointer paVar18;
  long lVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  aiVector3t<double> res;
  IfcVector3 base_1;
  TempMesh meshout;
  IfcVector3 pos;
  IfcVector3 axis;
  IfcMatrix4 trafo;
  aiVector3t<double> local_228;
  undefined1 local_208 [16];
  pointer local_1f0;
  pointer local_1e8;
  long local_1e0;
  double local_1d8;
  undefined8 uStack_1d0;
  long local_1c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  aiVector3t<double> local_198;
  TempMesh local_178;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  IfcVector3 local_118;
  IfcVector3 local_f8;
  IfcRevolvedAreaSolid *local_d8;
  long local_d0;
  long local_c8;
  ulong local_c0;
  IfcMatrix4 local_b8;
  
  local_178.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar9 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProfileDef>
                     (*(LazyObject **)
                       &(solid->super_IfcSweptAreaSolid).super_IfcSolidModel.field_0x40);
  bVar7 = ProcessProfile(pIVar9,&local_178,conv);
  if ((bVar7) &&
     (1 < (ulong)(((long)local_178.mVerts.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_178.mVerts.
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) {
    local_f8.x = 0.0;
    local_f8.y = 0.0;
    local_f8.z = 0.0;
    local_118.z = 0.0;
    local_118.x = 0.0;
    local_118.y = 0.0;
    in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis1Placement>
                   (*(LazyObject **)&(solid->super_IfcSweptAreaSolid).field_0x60);
    ConvertAxisPlacement(&local_f8,&local_118,in);
    paVar4 = local_178.mVerts.
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    paVar18 = local_178.mVerts.
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_148 = local_118.x;
    uStack_140 = 0;
    local_138 = local_118.y;
    uStack_130 = 0;
    local_1d8 = local_118.z;
    uStack_1d0 = 0;
    pIVar9 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProfileDef>
                       (*(LazyObject **)
                         &(solid->super_IfcSweptAreaSolid).super_IfcSolidModel.field_0x40);
    local_1f0 = paVar4;
    local_1e8 = paVar18;
    lVar13 = (long)paVar4 - (long)paVar18 >> 3;
    uVar14 = lVar13 * -0x5555555555555555;
    iVar8 = std::__cxx11::string::compare
                      (&(pIVar9->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                        field_0x10);
    dVar22 = solid->Angle * conv->angle_scale;
    dVar33 = ABS(dVar22);
    if (0.001 <= dVar33) {
      local_208._8_8_ = 0;
      local_208._0_8_ = dVar22;
      uVar10 = (ulong)(((double)conv->settings->cylindricalTessellation * dVar33) /
                      1.5707963705062866);
      uVar16 = 2;
      if (2 < (uint)uVar10) {
        uVar16 = uVar10 & 0xffffffff;
      }
      bVar7 = (2 < uVar14 && iVar8 == 0) && dVar33 < 6.220353627204895;
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&result->mVerts,((uint)bVar7 * 2 + (int)uVar16 * 4 + 4) * uVar14);
      local_1c0 = &result->mVertcnt;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (local_1c0,uVar16 * uVar14 + 2);
      uVar20 = local_208._12_4_;
      dVar33 = local_208._0_8_ / (double)uVar16;
      local_208._8_4_ = local_208._8_4_;
      local_208._0_8_ = dVar33;
      local_208._12_4_ = uVar20;
      local_c0 = uVar16;
      dVar33 = cos(dVar33);
      dVar22 = ::sin((double)local_208._0_8_);
      dVar21 = local_f8.z;
      dVar5 = local_f8.x;
      local_208._0_8_ = local_f8.y;
      if (local_1f0 != local_1e8) {
        lVar17 = uVar14 + (uVar14 == 0);
        lVar19 = 0;
        do {
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::_M_fill_insert
                    (&result->mVerts,
                     (result->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,4,
                     (value_type *)
                     ((long)&(local_178.mVerts.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->x + lVar19));
          lVar19 = lVar19 + 0x18;
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
      }
      dVar32 = 1.0 - dVar33;
      dVar25 = dVar32 * dVar5;
      dVar39 = dVar25 * dVar5 + dVar33;
      dVar24 = dVar25 * (double)local_208._0_8_ - dVar22 * dVar21;
      dVar36 = dVar25 * dVar21 + dVar22 * (double)local_208._0_8_;
      dVar35 = dVar25 * (double)local_208._0_8_ + dVar22 * dVar21;
      dVar23 = (double)local_208._0_8_ * dVar32 * (double)local_208._0_8_ + dVar33;
      dVar26 = dVar32 * (double)local_208._0_8_ * dVar21;
      dVar38 = dVar26 - dVar22 * dVar5;
      dVar25 = dVar25 * dVar21 - dVar22 * (double)local_208._0_8_;
      dVar26 = dVar26 + dVar22 * dVar5;
      dVar33 = dVar32 * dVar21 * dVar21 + dVar33;
      dVar27 = dVar35 * 0.0;
      dVar29 = dVar23 * 0.0;
      dVar40 = dVar39 * 0.0;
      dVar22 = dVar24 * 0.0;
      dVar30 = dVar38 * 0.0;
      dVar37 = dVar36 * 0.0;
      dVar32 = dVar25 * 0.0;
      dVar31 = local_148 * 0.0;
      dVar21 = dVar39 + dVar27 + dVar32 + dVar31;
      dVar39 = dVar26 * 0.0;
      dVar28 = dVar24 + dVar29 + dVar39 + dVar31;
      dVar34 = dVar33 * 0.0;
      dVar31 = dVar36 + dVar30 + dVar34 + dVar31;
      dVar5 = -local_148;
      local_128._8_4_ = (int)uStack_140;
      local_128._0_8_ = dVar5;
      local_128._12_4_ = (uint)((ulong)uStack_140 >> 0x20) ^ 0x80000000;
      dVar36 = local_138 * 0.0;
      dVar32 = dVar35 + dVar40 + dVar32 + dVar36;
      dVar24 = dVar23 + dVar22 + dVar39 + dVar36;
      dVar36 = dVar38 + dVar37 + dVar34 + dVar36;
      dVar23 = local_1d8 * 0.0;
      dVar34 = dVar40 + dVar27 + dVar25 + dVar23;
      dVar26 = dVar22 + dVar29 + dVar26 + dVar23;
      dVar23 = dVar37 + dVar30 + dVar33 + dVar23;
      dVar22 = (local_148 + 0.0) * 0.0;
      dVar39 = dVar21 + dVar28 * 0.0 + dVar31 * 0.0 + dVar22;
      dVar33 = dVar21 * 0.0 + dVar28 + dVar31 * 0.0 + dVar22;
      dVar22 = dVar21 * 0.0 + dVar28 * 0.0 + dVar31 + dVar22;
      dVar25 = -local_138;
      dVar27 = -local_1d8;
      dVar28 = dVar31 * dVar27 + dVar28 * dVar25 + dVar5 * dVar21 + local_148 + 0.0;
      dVar21 = (local_138 + 0.0) * 0.0;
      local_1a0 = dVar32 + dVar24 * 0.0 + dVar36 * 0.0 + dVar21;
      local_1a8 = dVar32 * 0.0 + dVar24 + dVar36 * 0.0 + dVar21;
      local_208._0_8_ = dVar32 * 0.0 + dVar24 * 0.0 + dVar36 + dVar21;
      local_138 = dVar36 * dVar27 + dVar24 * dVar25 + dVar5 * dVar32 + local_138 + 0.0;
      local_148 = (local_1d8 + 0.0) * 0.0;
      local_1b0 = dVar34 + dVar26 * 0.0 + dVar23 * 0.0 + local_148;
      local_1b8 = dVar34 * 0.0 + dVar26 + dVar23 * 0.0 + local_148;
      local_148 = dVar34 * 0.0 + dVar26 * 0.0 + dVar23 + local_148;
      local_1d8 = dVar23 * dVar27 + dVar34 * dVar5 + dVar26 * dVar25 + local_1d8 + 0.0;
      local_c8 = lVar13 * -0x5555555555555554;
      uVar10 = 0;
      local_d0 = lVar13 * 0x20;
      lVar17 = -0x18;
      local_1c8 = 0x48;
      lVar19 = 0;
      local_d8 = solid;
      do {
        local_128._0_8_ = uVar10;
        local_1e0 = lVar17;
        if (local_1f0 != local_1e8) {
          uVar10 = 1;
          lVar17 = local_1c8;
          do {
            local_b8.a1 = (double)CONCAT44(local_b8.a1._4_4_,4);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (local_1c0,(uint *)&local_b8);
            paVar18 = (result->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            local_b8.a3 = *(double *)((long)&paVar18->z + lVar17);
            pdVar2 = (double *)((long)&paVar18->x + lVar17);
            local_b8.a1 = *pdVar2;
            local_b8.a2 = pdVar2[1];
            lVar15 = lVar19 + 3 + (uVar10 % uVar14) * 4;
            local_198.z = paVar18[lVar15].z;
            local_198.x = paVar18[lVar15].x;
            local_198.y = paVar18[lVar15].y;
            iVar3._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (result->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>const&>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                         iVar3,(aiVector3t<double> *)&local_b8);
            }
            else {
              (iVar3._M_current)->z = local_b8.a3;
              (iVar3._M_current)->x = local_b8.a1;
              (iVar3._M_current)->y = local_b8.a2;
              ppaVar1 = &(result->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            iVar3._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (result->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>const&>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                         iVar3,&local_198);
            }
            else {
              (iVar3._M_current)->z = local_198.z;
              (iVar3._M_current)->x = local_198.x;
              (iVar3._M_current)->y = local_198.y;
              ppaVar1 = &(result->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            local_228.x = dVar22 * local_198.z + dVar39 * local_198.x + dVar33 * local_198.y +
                          dVar28;
            local_228.y = (double)local_208._0_8_ * local_198.z +
                          local_1a0 * local_198.x + local_1a8 * local_198.y + local_138;
            local_228.z = local_198.z * local_148 +
                          local_198.x * local_1b0 + local_198.y * local_1b8 + local_1d8;
            iVar3._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (result->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                         iVar3,&local_228);
            }
            else {
              (iVar3._M_current)->z = local_228.z;
              (iVar3._M_current)->x = local_228.x;
              (iVar3._M_current)->y = local_228.y;
              ppaVar1 = &(result->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            local_228.x = dVar22 * local_b8.a3 + dVar39 * local_b8.a1 + dVar33 * local_b8.a2 +
                          dVar28;
            local_228.y = (double)local_208._0_8_ * local_b8.a3 +
                          local_1a0 * local_b8.a1 + local_1a8 * local_b8.a2 + local_138;
            local_228.z = local_b8.a3 * local_148 +
                          local_b8.a1 * local_1b0 + local_b8.a2 * local_1b8 + local_1d8;
            iVar3._M_current =
                 (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (result->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,
                         iVar3,&local_228);
            }
            else {
              (iVar3._M_current)->z = local_228.z;
              (iVar3._M_current)->x = local_228.x;
              (iVar3._M_current)->y = local_228.y;
              ppaVar1 = &(result->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
            }
            lVar17 = lVar17 + 0x60;
            lVar15 = uVar10 + (lVar13 * 0x5555555555555555 - (ulong)(uVar14 == 0));
            uVar10 = uVar10 + 1;
          } while (lVar15 != 0);
        }
        lVar15 = local_1e0;
        lVar19 = lVar19 + local_c8;
        uVar11 = local_128._0_4_ + 1;
        uVar10 = (ulong)uVar11;
        lVar17 = local_d0 + local_1e0;
        local_1c8 = local_1c8 + local_d0;
      } while (uVar11 != (uint)local_c0);
      if (local_1f0 != local_1e8) {
        paVar18 = (result->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        __src = (void *)(lVar13 * 0x20 + (long)paVar18);
        __n = (long)(result->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)__src;
        if (__n != 0) {
          memmove(paVar18,__src,__n);
        }
        paVar4 = (result->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        paVar18 = (pointer)((long)paVar18 + ((long)paVar4 - (long)__src));
        if (paVar4 != paVar18) {
          (result->mVerts).
          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish = paVar18;
        }
      }
      pIVar6 = local_d8;
      uVar10 = uVar14;
      if (bVar7) {
        do {
          paVar12 = (aiVector3t<double> *)
                    ((long)&((result->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->x + lVar15);
          iVar3._M_current =
               (result->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (result->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_realloc_insert<aiVector3t<double>const&>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,iVar3
                       ,paVar12);
          }
          else {
            (iVar3._M_current)->z = paVar12->z;
            dVar33 = paVar12->y;
            (iVar3._M_current)->x = paVar12->x;
            (iVar3._M_current)->y = dVar33;
            ppaVar1 = &(result->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
          }
          uVar10 = uVar10 - 1;
          lVar15 = lVar15 + -0x60;
        } while (uVar10 != 0);
        lVar13 = 0;
        uVar10 = uVar14;
        do {
          paVar12 = (aiVector3t<double> *)
                    ((long)&((result->mVerts).
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->x + lVar13);
          iVar3._M_current =
               (result->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (result->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
            _M_realloc_insert<aiVector3t<double>const&>
                      ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)result,iVar3
                       ,paVar12);
          }
          else {
            (iVar3._M_current)->z = paVar12->z;
            dVar33 = paVar12->y;
            (iVar3._M_current)->x = paVar12->x;
            (iVar3._M_current)->y = dVar33;
            ppaVar1 = &(result->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
          }
          this = local_1c0;
          lVar13 = lVar13 + 0x60;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        local_b8.a1._0_4_ = (int)uVar14;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (local_1c0,(uint *)&local_b8);
        local_b8.a1 = (double)CONCAT44(local_b8.a1._4_4_,(int)uVar14);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this,(uint *)&local_b8);
      }
      local_b8.a1 = 1.0;
      local_b8.a2 = 0.0;
      local_b8.a3 = 0.0;
      local_b8.a4 = 0.0;
      local_b8.b1 = 0.0;
      local_b8.b2 = 1.0;
      local_b8.b3 = 0.0;
      local_b8.b4 = 0.0;
      local_b8.c1 = 0.0;
      local_b8.c2 = 0.0;
      local_b8.c3 = 1.0;
      local_b8.c4 = 0.0;
      local_b8.d1 = 0.0;
      local_b8.d2 = 0.0;
      local_b8.d3 = 0.0;
      local_b8.d4 = 1.0;
      in_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                        ((pIVar6->super_IfcSweptAreaSolid).Position.obj);
      ConvertAxisPlacement(&local_b8,in_00);
      TempMesh::Transform(result,&local_b8);
      LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x58cb4f);
    }
    else if (2 < uVar14 && iVar8 == 0) {
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator=
                (&result->mVerts,&local_178.mVerts);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&result->mVertcnt,&local_178.mVertcnt);
    }
  }
  if (local_178.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.mVertcnt.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.mVertcnt.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.mVertcnt.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_178.mVerts.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.mVerts.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.mVerts.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.mVerts.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProcessRevolvedAreaSolid(const Schema_2x3::IfcRevolvedAreaSolid& solid, TempMesh& result, ConversionData& conv)
{
    TempMesh meshout;

    // first read the profile description
    if(!ProcessProfile(*solid.SweptArea,meshout,conv) || meshout.mVerts.size()<=1) {
        return;
    }

    IfcVector3 axis, pos;
    ConvertAxisPlacement(axis,pos,solid.Axis);

    IfcMatrix4 tb0,tb1;
    IfcMatrix4::Translation(pos,tb0);
    IfcMatrix4::Translation(-pos,tb1);

    const std::vector<IfcVector3>& in = meshout.mVerts;
    const size_t size=in.size();

    bool has_area = solid.SweptArea->ProfileType == "AREA" && size>2;
    const IfcFloat max_angle = solid.Angle*conv.angle_scale;
    if(std::fabs(max_angle) < 1e-3) {
        if(has_area) {
            result = meshout;
        }
        return;
    }

    const unsigned int cnt_segments = std::max(2u,static_cast<unsigned int>(conv.settings.cylindricalTessellation * std::fabs(max_angle)/AI_MATH_HALF_PI_F));
    const IfcFloat delta = max_angle/cnt_segments;

    has_area = has_area && std::fabs(max_angle) < AI_MATH_TWO_PI_F*0.99;

    result.mVerts.reserve(size*((cnt_segments+1)*4+(has_area?2:0)));
    result.mVertcnt.reserve(size*cnt_segments+2);

    IfcMatrix4 rot;
    rot = tb0 * IfcMatrix4::Rotation(delta,axis,rot) * tb1;

    size_t base = 0;
    std::vector<IfcVector3>& out = result.mVerts;

    // dummy data to simplify later processing
    for(size_t i = 0; i < size; ++i) {
        out.insert(out.end(),4,in[i]);
    }

    for(unsigned int seg = 0; seg < cnt_segments; ++seg) {
        for(size_t i = 0; i < size; ++i) {
            const size_t next = (i+1)%size;

            result.mVertcnt.push_back(4);
            const IfcVector3 base_0 = out[base+i*4+3],base_1 = out[base+next*4+3];

            out.push_back(base_0);
            out.push_back(base_1);
            out.push_back(rot*base_1);
            out.push_back(rot*base_0);
        }
        base += size*4;
    }

    out.erase(out.begin(),out.begin()+size*4);

    if(has_area) {
        // leave the triangulation of the profile area to the ear cutting
        // implementation in aiProcess_Triangulate - for now we just
        // feed in two huge polygons.
        base -= size*8;
        for(size_t i = size; i--; ) {
            out.push_back(out[base+i*4+3]);
        }
        for(size_t i = 0; i < size; ++i ) {
            out.push_back(out[i*4]);
        }
        result.mVertcnt.push_back(static_cast<unsigned int>(size));
        result.mVertcnt.push_back(static_cast<unsigned int>(size));
    }

    IfcMatrix4 trafo;
    ConvertAxisPlacement(trafo, solid.Position);

    result.Transform(trafo);
    IFCImporter::LogDebug("generate mesh procedurally by radial extrusion (IfcRevolvedAreaSolid)");
}